

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhstsstore.cpp
# Opt level: O2

bool __thiscall QHstsStore::serializePolicy(QHstsStore *this,QString *key,QHstsPolicy *policy)

{
  char16_t *pcVar1;
  ulong uVar2;
  char cVar3;
  bool i;
  longlong lVar4;
  long in_FS_OFFSET;
  QAnyStringView QVar5;
  QArrayDataPointer<char> local_98;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.d = (Data *)0x0;
  local_98.ptr = (char *)0x0;
  local_98.size = 0;
  local_68 = 0xaaaaaaaa;
  uStack_64 = 0xaaaaaaaa;
  uStack_60 = 0xaaaaaaaa;
  uStack_5c = 0xaaaaaaaa;
  local_78 = 0xaaaaaaaa;
  uStack_74 = 0xaaaaaaaa;
  uStack_70 = 0xaaaaaaaa;
  uStack_6c = 0xaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_78,&local_98,2);
  QHstsPolicy::expiry((QHstsPolicy *)&local_58);
  lVar4 = QDateTime::toMSecsSinceEpoch();
  QDataStream::operator<<((QDataStream *)&local_78,lVar4);
  QDateTime::~QDateTime((QDateTime *)&local_58);
  i = QHstsPolicy::includesSubDomains(policy);
  QDataStream::operator<<<bool,_true>((QDataStream *)&local_78,i);
  cVar3 = local_68._3_1_;
  if (local_68._3_1_ == '\0') {
    pcVar1 = (key->d).ptr;
    uVar2 = (key->d).size;
    QVariant::QVariant(&local_58,(QByteArray *)&local_98);
    QVar5.m_size = (size_t)pcVar1;
    QVar5.field_0.m_data = &this->store;
    QSettings::setValue(QVar5,(QVariant *)(uVar2 | 0x8000000000000000));
    QVariant::~QVariant(&local_58);
  }
  QDataStream::~QDataStream((QDataStream *)&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return cVar3 == '\0';
  }
  __stack_chk_fail();
}

Assistant:

bool QHstsStore::serializePolicy(const QString &key, const QHstsPolicy &policy)
{
    Q_ASSERT(store.isWritable());

    QByteArray serializedData;
    QDataStream streamer(&serializedData, QIODevice::WriteOnly);
    streamer << policy.expiry().toMSecsSinceEpoch();
    streamer << policy.includesSubDomains();

    if (streamer.status() != QDataStream::Ok)
        return false;

    store.setValue(key, serializedData);
    return true;
}